

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

void __thiscall DataContainer::BuildFileList(DataContainer *this)

{
  int iVar1;
  char *__file;
  undefined1 local_a0 [8];
  stat s;
  DataContainer *this_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)this;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a0);
  if (iVar1 == 0) {
    if (((uint)s.st_nlink & 0x4000) == 0) {
      BuildFromFile(this);
    }
    else {
      BuildFromDirectory(this);
    }
  }
  return;
}

Assistant:

void DataContainer::BuildFileList()
{
   // Is this a file or a directory ?
   struct stat s;

   if (stat(current_path_.c_str(), &s) == 0)
   {
      // Directory
      if (s.st_mode & S_IFDIR)
      {
         BuildFromDirectory();
      }
      else
      {
         // Is this a compressed file ?
         BuildFromFile();
      }
   }
}